

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portfwd.c
# Opt level: O1

char * pfl_listen(char *desthost,int destport,char *srcaddr,int port,ConnectionLayer *cl,Conf *conf,
                 PortListener **pl_ret,int address_family)

{
  _Bool _Var1;
  PortListener *ptr;
  char *pcVar2;
  Socket *pSVar3;
  
  ptr = (PortListener *)safemalloc(1,0x30,0);
  ptr->hostname = (char *)0x0;
  *pl_ret = ptr;
  (ptr->plug).vt = &PortListener_plugvt;
  if (desthost != (char *)0x0) {
    pcVar2 = dupstr(desthost);
    ptr->hostname = pcVar2;
    ptr->port = destport;
  }
  ptr->is_dynamic = desthost == (char *)0x0;
  ptr->cl = cl;
  _Var1 = conf_get_bool(conf,0xae);
  pSVar3 = new_listener(srcaddr,port,&ptr->plug,!_Var1,conf,address_family);
  ptr->s = pSVar3;
  pcVar2 = (*pSVar3->vt->socket_error)(pSVar3);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar2 = dupstr(pcVar2);
    (*ptr->s->vt->close)(ptr->s);
    safefree(ptr->hostname);
    safefree(ptr);
    *pl_ret = (PortListener *)0x0;
  }
  return pcVar2;
}

Assistant:

static char *pfl_listen(const char *desthost, int destport,
                        const char *srcaddr, int port,
                        ConnectionLayer *cl, Conf *conf,
                        struct PortListener **pl_ret, int address_family)
{
    const char *err;
    struct PortListener *pl;

    /*
     * Open socket.
     */
    pl = *pl_ret = new_portlistener_state();
    pl->plug.vt = &PortListener_plugvt;
    if (desthost) {
        pl->hostname = dupstr(desthost);
        pl->port = destport;
        pl->is_dynamic = false;
    } else
        pl->is_dynamic = true;
    pl->cl = cl;

    pl->s = new_listener(srcaddr, port, &pl->plug,
                         !conf_get_bool(conf, CONF_lport_acceptall),
                         conf, address_family);
    if ((err = sk_socket_error(pl->s)) != NULL) {
        char *err_ret = dupstr(err);
        sk_close(pl->s);
        free_portlistener_state(pl);
        *pl_ret = NULL;
        return err_ret;
    }

    return NULL;
}